

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O3

void boost::throw_exception<boost::lock_error>(lock_error *e)

{
  clone_impl<boost::exception_detail::error_info_injector<boost::lock_error>_> *this;
  error_info_injector<boost::lock_error> local_80;
  
  this = (clone_impl<boost::exception_detail::error_info_injector<boost::lock_error>_> *)
         __cxa_allocate_exception(0x70);
  exception_detail::error_info_injector<boost::lock_error>::error_info_injector(&local_80,e);
  exception_detail::clone_impl<boost::exception_detail::error_info_injector<boost::lock_error>_>::
  clone_impl(this,&local_80);
  __cxa_throw(this,&exception_detail::
                    clone_impl<boost::exception_detail::error_info_injector<boost::lock_error>>::
                    typeinfo,
              exception_detail::
              clone_impl<boost::exception_detail::error_info_injector<boost::lock_error>_>::
              ~clone_impl);
}

Assistant:

BOOST_NORETURN inline void throw_exception( E const & e )
{
    //All boost exceptions are required to derive from std::exception,
    //to ensure compatibility with BOOST_NO_EXCEPTIONS.
    throw_exception_assert_compatibility(e);

#ifndef BOOST_EXCEPTION_DISABLE
    throw enable_current_exception(enable_error_info(e));
#else
    throw e;
#endif
}